

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void multi_process_server(int port,string *ip,string *log_file)

{
  int sockfd;
  __cxx11 local_270 [32];
  __cxx11 local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  __cxx11 local_1b0 [32];
  __cxx11 local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [39];
  allocator local_e9;
  string local_e8 [36];
  __pid_t local_c4;
  undefined1 local_c0 [4];
  pid_t pid;
  client_socket client;
  undefined1 local_58 [4];
  int listened_sockfd;
  Log log;
  int client_num;
  string *log_file_local;
  string *ip_local;
  int port_local;
  
  log.sem._4_4_ = 0;
  Log::Log((Log *)local_58,log_file);
  sockfd = C_std::Network::Socket(2,1,0);
  std::__cxx11::string::string((string *)&client.port,(string *)ip);
  C_std::Network::easy_bind(sockfd,port,(string *)&client.port);
  std::__cxx11::string::~string((string *)&client.port);
  C_std::Network::Listen(sockfd,0x80);
  catch_signal();
  do {
    C_std::Network::easy_accept((client_socket *)local_c0,sockfd);
    local_c4 = fork();
    if (local_c4 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"fork error",&local_e9);
      perror_exit((string *)local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    else {
      if (local_c4 == 0) {
        C_std::Close(sockfd);
        std::__cxx11::to_string(local_190,log.sem._4_4_ + 1);
        std::operator+(local_170,(char *)local_190);
        std::operator+(local_150,local_170);
        std::operator+(local_130,(char *)local_150);
        std::__cxx11::to_string(local_1b0,client._32_4_);
        std::operator+(local_110,local_130);
        Log::print((Log *)local_58,local_110);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)local_190);
        server_func((client_socket *)local_c0);
        std::__cxx11::to_string(local_250,log.sem._4_4_ + 1);
        std::operator+(local_230,(char *)local_250);
        std::operator+(local_210,local_230);
        std::operator+(local_1f0,(char *)local_210);
        std::__cxx11::to_string(local_270,client._32_4_);
        std::operator+(local_1d0,local_1f0);
        Log::print((Log *)local_58,local_1d0);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string((string *)local_270);
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::string::~string((string *)local_210);
        std::__cxx11::string::~string((string *)local_230);
        std::__cxx11::string::~string((string *)local_250);
        exit(1);
      }
      C_std::Close((int)local_c0);
      log.sem._4_4_ = log.sem._4_4_ + 1;
    }
    C_std::Network::client_socket::~client_socket((client_socket *)local_c0);
  } while( true );
}

Assistant:

void multi_process_server(int port, const std::string &ip, const std::string &log_file) {
    int client_num = 0;
    Log log(log_file);
    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);

    catch_signal();

    while(1) {
        client_socket client(easy_accept(listened_sockfd));
        pid_t pid = fork();
        if (pid < 0) {
            perror_exit("fork error");
        } else if (pid == 0) {
            //子进程逻辑
            Close(listened_sockfd);
            log.print(std::to_string(client_num + 1) + "th client connected : " + client.ip + " : " + std::to_string(client.port));
            server_func(client);
            log.print(std::to_string(client_num + 1) + "th client disconnect: " + client.ip + " : " + std::to_string(client.port));
            exit(1);
        } else {
            //父进程逻辑
            Close(client.sockfd);
            ++client_num;
        }
    }
}